

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O0

int CBS_get_ucs2_be(CBS *cbs,uint32_t *out)

{
  int iVar1;
  ushort local_22;
  uint32_t *puStack_20;
  uint16_t c;
  uint32_t *out_local;
  CBS *cbs_local;
  
  puStack_20 = out;
  out_local = (uint32_t *)cbs;
  iVar1 = CBS_get_u16(cbs,&local_22);
  if ((iVar1 != 0) && (iVar1 = is_valid_code_point((uint)local_22), iVar1 != 0)) {
    *puStack_20 = (uint)local_22;
    return 1;
  }
  return 0;
}

Assistant:

int CBS_get_ucs2_be(CBS *cbs, uint32_t *out) {
  // Note UCS-2 (used by BMPString) does not support surrogates.
  uint16_t c;
  if (!CBS_get_u16(cbs, &c) ||
      !is_valid_code_point(c)) {
    return 0;
  }
  *out = c;
  return 1;
}